

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaBlockBufferImageGranularity::Init
          (VmaBlockBufferImageGranularity *this,VkAllocationCallbacks *pAllocationCallbacks,
          VkDeviceSize size)

{
  ulong uVar1;
  RegionInfo *__s;
  
  uVar1 = this->m_BufferImageGranularity;
  if (0x100 < uVar1) {
    uVar1 = ((size + uVar1) - 1) / uVar1;
    this->m_RegionCount = (uint32_t)uVar1;
    __s = (RegionInfo *)VmaMalloc(pAllocationCallbacks,(uVar1 & 0xffffffff) << 2,2);
    this->m_RegionInfo = __s;
    memset(__s,0,(ulong)this->m_RegionCount << 2);
    return;
  }
  return;
}

Assistant:

bool IsEnabled() const { return m_BufferImageGranularity > MAX_LOW_BUFFER_IMAGE_GRANULARITY; }